

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_dedicatedDictSearch_getCParams
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,size_t dictSize)

{
  ZSTD_compressionParameters *cParams;
  size_t dictSize_local;
  int compressionLevel_local;
  
  ZSTD_getCParams_internal(__return_storage_ptr__,compressionLevel,0,dictSize,ZSTD_cpm_createCDict);
  if ((1 < __return_storage_ptr__->strategy - ZSTD_fast) &&
     (__return_storage_ptr__->strategy - ZSTD_greedy < 3)) {
    __return_storage_ptr__->hashLog = __return_storage_ptr__->hashLog + 2;
  }
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_dedicatedDictSearch_getCParams(int const compressionLevel, size_t const dictSize)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams_internal(compressionLevel, 0, dictSize, ZSTD_cpm_createCDict);
    switch (cParams.strategy) {
        case ZSTD_fast:
        case ZSTD_dfast:
            break;
        case ZSTD_greedy:
        case ZSTD_lazy:
        case ZSTD_lazy2:
            cParams.hashLog += ZSTD_LAZY_DDSS_BUCKET_LOG;
            break;
        case ZSTD_btlazy2:
        case ZSTD_btopt:
        case ZSTD_btultra:
        case ZSTD_btultra2:
            break;
    }
    return cParams;
}